

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O0

char16 * Js::NarrowStringToWide(Context *ctx,char *src,size_t *srcSize,charcount_t *dstSize)

{
  HRESULT HVar1;
  size_t local_58;
  charcount_t local_3c;
  HRESULT hr;
  charcount_t size;
  char16 *dst;
  anon_class_8_1_ba1d3d87 allocator;
  charcount_t *dstSize_local;
  size_t *srcSize_local;
  char *src_local;
  Context *ctx_local;
  
  _hr = (char16 *)0x0;
  dst = (char16 *)&src_local;
  allocator.ctx = (Context **)dstSize;
  src_local = (char *)ctx;
  if (srcSize == (size_t *)0x0) {
    local_58 = strlen(src);
  }
  else {
    local_58 = *srcSize;
  }
  HVar1 = utf8::
          NarrowStringToWide<Js::NarrowStringToWide(Js::Context*,char_const*,unsigned_long_const*,unsigned_int*)::__0>
                    ((anon_class_8_1_ba1d3d87)&src_local,src,local_58,(LPWSTR *)&hr,&local_3c,
                     (size_t *)0x0);
  if (HVar1 != 0) {
    JavascriptError::ThrowOutOfMemoryError(*(ScriptContext **)(src_local + 8));
  }
  if (allocator.ctx != (Context **)0x0) {
    *(charcount_t *)allocator.ctx = local_3c;
  }
  return _hr;
}

Assistant:

char16* NarrowStringToWide(Context* ctx, const char* src, const size_t* srcSize = nullptr, charcount_t* dstSize = nullptr)
{
    auto allocator = [&ctx](size_t size) {return (char16*)AnewArray(ctx->allocator, char16, size); };
    char16* dst = nullptr;
    charcount_t size;
    HRESULT hr = utf8::NarrowStringToWide(allocator, src, srcSize ? *srcSize : strlen(src), &dst, &size);
    if (hr != S_OK)
    {
        JavascriptError::ThrowOutOfMemoryError(ctx->scriptContext);
    }
    if (dstSize)
    {
        *dstSize = size;
    }
    return dst;
}